

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeKRMmatricesGlobal
          (ChElementTetraCorot_10 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  ChMatrix33<double> *R;
  double dVar1;
  double dVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int blockCols;
  Scalar *pSVar8;
  int id;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_128;
  ChMatrixDynamic<> CKCt;
  ChMatrixDynamic<> CK;
  double mkfactor;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_b0;
  ChMatrixRef local_80;
  ChMatrixRef local_58;
  
  lVar9 = (H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value;
  iVar7 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])();
  if (lVar9 == iVar7) {
    lVar9 = (H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value;
    iVar7 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
    if (lVar9 == iVar7) {
      local_128.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data._0_4_ = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
      local_b0._0_4_ = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&CK,(int *)&local_128,(int *)&local_b0);
      local_128.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data._0_4_ = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
      local_b0._0_4_ = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&CKCt,(int *)&local_128,(int *)&local_b0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_128,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&this->StiffnessMatrix,
                 (type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_58,
                 &CK.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(type *)0x0);
      R = &(this->super_ChElementCorotational).A;
      ChMatrixCorotation::ComputeCK(&local_128,R,10,&local_58);
      Eigen::internal::handmade_aligned_free
                (local_128.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                 .m_storage.m_data);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_128,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&CK,(type *)0x0)
      ;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_80,
                 &CKCt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(type *)0x0)
      ;
      ChMatrixCorotation::ComputeKCt(&local_128,R,10,&local_80);
      Eigen::internal::handmade_aligned_free
                (local_128.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                 .m_storage.m_data);
      std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_128,
                 &(this->Material).
                  super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = Rfactor;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = Kfactor;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(CONCAT44(local_128.
                                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                         .
                                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                         .m_data._4_4_,
                                         (int)local_128.
                                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                              .
                                              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                              .m_data) + 0x50);
      auVar4 = vfmadd231sd_fma(auVar13,auVar10,auVar4);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_128.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows);
      mkfactor = auVar4._0_8_;
      Eigen::operator*(&local_b0,&mkfactor,(StorageBaseType *)&CKCt);
      iVar7 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
      blockCols = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
      Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>::
      block<int,int>((Type *)&local_128,H,0,0,iVar7,blockCols);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                  *)&local_128,&local_b0);
      if ((Mfactor != 0.0) || (NAN(Mfactor))) {
        dVar1 = this->Volume;
        dVar2 = (((this->Material).
                  super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_ChContinuumMaterial).density;
        iVar7 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[3])(this);
        lVar9 = 0;
        auVar12._0_8_ = (dVar2 * dVar1) / (double)iVar7;
        while( true ) {
          iVar7 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
          if (iVar7 <= lVar9) break;
          std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr((__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_128,
                       &(this->Material).
                        super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                      );
          uVar3 = *(ulong *)(CONCAT44(local_128.
                                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                      .
                                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                      .m_data._4_4_,
                                      (int)local_128.
                                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                           .
                                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                           .m_data) + 0x48);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_128.
                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      .
                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_rows);
          pSVar8 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 *)H,lVar9,lVar9);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = Rfactor;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar3;
          lVar9 = lVar9 + 1;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = Mfactor;
          auVar4 = vfmadd213sd_fma(auVar14,auVar11,auVar5);
          auVar12._8_8_ = 0;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *pSVar8;
          auVar4 = vfmadd213sd_fma(auVar4,auVar12,auVar6);
          *pSVar8 = auVar4._0_8_;
        }
      }
      Eigen::internal::handmade_aligned_free
                (CKCt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (CK.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                 m_data);
      return;
    }
  }
  __assert_fail("(H.rows() == GetNdofs()) && (H.cols() == GetNdofs())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_10.cpp"
                ,0x232,
                "virtual void chrono::fea::ChElementTetraCorot_10::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementTetraCorot_10::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == GetNdofs()) && (H.cols() == GetNdofs()));

    // warp the local stiffness matrix K in order to obtain global tangent stiffness CKCt:
    ChMatrixDynamic<> CK(GetNdofs(), GetNdofs());
    ChMatrixDynamic<> CKCt(GetNdofs(), GetNdofs());  // the global, corotated, K matrix
    ChMatrixCorotation::ComputeCK(StiffnessMatrix, this->A, 10, CK);
    ChMatrixCorotation::ComputeKCt(CK, this->A, 10, CKCt);

    // For K stiffness matrix and R damping matrix:
    double mkfactor = Kfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingK();
    H.block(0, 0, GetNdofs(), GetNdofs()) = mkfactor * CKCt;

    // For M mass matrix:
    if (Mfactor) {
        double lumped_node_mass = (this->GetVolume() * this->Material->Get_density()) / (double)this->GetNnodes();
        for (int id = 0; id < GetNdofs(); id++) {
            double amfactor = Mfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingM();
            H(id, id) += amfactor * lumped_node_mass;
        }
    }
    //***TO DO*** better per-node lumping, or 30x30 consistent mass matrix.
}